

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_string_utf8_ref(sexp ctx,sexp str,sexp i)

{
  byte bVar1;
  sexp psVar2;
  undefined1 auVar3 [16];
  sexp_tag_t *psVar4;
  uint uVar5;
  long lVar6;
  sexp psVar7;
  uint uVar8;
  
  psVar7 = (str->value).type.name;
  psVar2 = (str->value).type.cpl;
  auVar3._8_8_ = (long)i >> 0x3f;
  auVar3._0_8_ = (ulong)i & 0xfffffffffffffffd;
  lVar6 = SUB168(auVar3 / SEXT816(8),0);
  bVar1 = (psVar2->value).flonum_bits[(long)&psVar7->value + lVar6];
  if (-1 < (long)(char)bVar1) {
    return (sexp)((long)(char)bVar1 << 8 | 0x1e);
  }
  if ((byte)(bVar1 + 8) < 200) {
    psVar7 = sexp_user_exception(ctx,(sexp)0x0,"string-ref: invalid utf8 byte",i);
    return psVar7;
  }
  psVar4 = &psVar7->tag;
  if (bVar1 < 0xe0) {
    uVar5 = (byte)(psVar2->value).flonum_bits[(long)psVar4 + lVar6 + 9] & 0x3f | (bVar1 & 0x3f) << 6
    ;
  }
  else {
    uVar5 = (byte)(psVar2->value).flonum_bits[(long)psVar4 + lVar6 + 9] & 0x3f;
    uVar8 = (byte)(psVar2->value).flonum_bits[(long)psVar4 + lVar6 + 10] & 0x3f;
    if (bVar1 < 0xf0) {
      return (sexp)(ulong)((uVar5 << 6 | (bVar1 & 0x1f) << 0xc | uVar8) << 8 | 0x1e);
    }
    uVar5 = (byte)(psVar2->value).flonum_bits[(long)psVar4 + lVar6 + 0xb] & 0x3f |
            uVar8 << 6 | uVar5 << 0xc | (bVar1 & 0xf) << 0x12;
  }
  return (sexp)(ulong)(uVar5 << 8 | 0x1e);
}

Assistant:

sexp sexp_string_utf8_ref (sexp ctx, sexp str, sexp i) {
  unsigned char *p=(unsigned char*)sexp_string_data(str) + sexp_unbox_string_cursor(i);
  if (*p < 0x80)
    return sexp_make_character(*p);
  else if ((*p < 0xC0) || (*p > 0xF7))
    return sexp_user_exception(ctx, NULL, "string-ref: invalid utf8 byte", i);
  else if (*p < 0xE0)
    return sexp_make_character(((p[0]&0x3F)<<6) + (p[1]&0x3F));
  else if (*p < 0xF0)
    return sexp_make_character(((p[0]&0x1F)<<12) + ((p[1]&0x3F)<<6) + (p[2]&0x3F));
  else
    return sexp_make_character(((p[0]&0x0F)<<18) + ((p[1]&0x3F)<<12) + ((p[2]&0x3F)<<6) + (p[3]&0x3F));
}